

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O2

void __thiscall Renderer::Render(Renderer *this,Snake *snake,Snake *snake2,SDL_Point *food)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer pSVar5;
  Snake *pSVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  undefined8 uVar10;
  int iVar11;
  SDL_Point *point;
  pointer pSVar12;
  undefined8 local_48;
  int local_40;
  int iStack_3c;
  Snake *local_38;
  
  iVar9 = (int)(this->screen_width / this->grid_width);
  iVar11 = (int)(this->screen_height / this->grid_height);
  local_40 = iVar9;
  iStack_3c = iVar11;
  local_38 = snake2;
  SDL_SetRenderDrawColor(this->sdl_renderer,0x1e,0x1e,0x1e,0xff);
  SDL_RenderClear(this->sdl_renderer);
  SDL_SetRenderDrawColor(this->sdl_renderer,0xff,0xcc,0,0xff);
  local_48 = CONCAT44(iVar11 * food->y,iVar9 * food->x);
  SDL_RenderFillRect(this->sdl_renderer,&local_48);
  SDL_SetRenderDrawColor(this->sdl_renderer,0xff,0xff,0xff,0xff);
  pSVar5 = (snake->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar12 = (snake->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
                 super__Vector_impl_data._M_start; pSVar12 != pSVar5; pSVar12 = pSVar12 + 1) {
    local_48 = CONCAT44(iStack_3c * pSVar12->y,local_40 * pSVar12->x);
    SDL_RenderFillRect(this->sdl_renderer);
  }
  uVar1 = snake->head_x;
  uVar3 = snake->head_y;
  local_48 = CONCAT44((int)(float)uVar3 * iStack_3c,local_40 * (int)(float)uVar1);
  if (snake->alive == false) {
    uVar10 = 0xff;
    uVar8 = 0;
    uVar7 = 0;
  }
  else {
    uVar8 = 0x7a;
    uVar10 = 0;
    uVar7 = 0xcc;
  }
  SDL_SetRenderDrawColor(this->sdl_renderer,uVar10,uVar8,uVar7,0xff);
  pSVar6 = local_38;
  SDL_RenderFillRect(this->sdl_renderer,&local_48);
  SDL_SetRenderDrawColor(this->sdl_renderer,0xff,0xff,0xff,0xff);
  pSVar5 = (pSVar6->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar12 = (pSVar6->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
                 super__Vector_impl_data._M_start; pSVar12 != pSVar5; pSVar12 = pSVar12 + 1) {
    local_48 = CONCAT44(iStack_3c * pSVar12->y,local_40 * pSVar12->x);
    SDL_RenderFillRect(this->sdl_renderer);
  }
  uVar2 = pSVar6->head_x;
  uVar4 = pSVar6->head_y;
  local_48 = CONCAT44((int)(float)uVar4 * iStack_3c,local_40 * (int)(float)uVar2);
  if (pSVar6->alive == false) {
    uVar10 = 0xff;
    uVar8 = 0;
    uVar7 = 0;
  }
  else {
    uVar8 = 0x7a;
    uVar10 = 0;
    uVar7 = 0xcc;
  }
  SDL_SetRenderDrawColor(this->sdl_renderer,uVar10,uVar8,uVar7,0xff);
  SDL_RenderFillRect(this->sdl_renderer,&local_48);
  SDL_RenderPresent(this->sdl_renderer);
  return;
}

Assistant:

void Renderer::Render(Snake const snake, Snake const snake2, SDL_Point const &food) {
  SDL_Rect block;
  block.w = screen_width / grid_width;
  block.h = screen_height / grid_height;

  // Clear screen
  SDL_SetRenderDrawColor(sdl_renderer, 0x1E, 0x1E, 0x1E, 0xFF);
  SDL_RenderClear(sdl_renderer);

  // Render food
  SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0xCC, 0x00, 0xFF);
  block.x = food.x * block.w;
  block.y = food.y * block.h;
  SDL_RenderFillRect(sdl_renderer, &block);

  // Render snake's body
  SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0xFF, 0xFF, 0xFF);
  for (SDL_Point const &point : snake.body) {
    block.x = point.x * block.w;
    block.y = point.y * block.h;
    SDL_RenderFillRect(sdl_renderer, &block);
  }

  // Render snake's head
  block.x = static_cast<int>(snake.head_x) * block.w;
  block.y = static_cast<int>(snake.head_y) * block.h;
  if (snake.alive) {
    SDL_SetRenderDrawColor(sdl_renderer, 0x00, 0x7A, 0xCC, 0xFF);
  } else {
    SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0x00, 0x00, 0xFF);
  }
  SDL_RenderFillRect(sdl_renderer, &block);
  
  // Render snake2's body
  SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0xFF, 0xFF, 0xFF);
  for (SDL_Point const &point : snake2.body) {
    block.x = point.x * block.w;
    block.y = point.y * block.h;
    SDL_RenderFillRect(sdl_renderer, &block);
  }

  // Render snake2's head
  block.x = static_cast<int>(snake2.head_x) * block.w;
  block.y = static_cast<int>(snake2.head_y) * block.h;
  if (snake2.alive) {
    SDL_SetRenderDrawColor(sdl_renderer, 0x00, 0x7A, 0xCC, 0xFF);
  } else {
    SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0x00, 0x00, 0xFF);
  }
  SDL_RenderFillRect(sdl_renderer, &block);
  
  // Update Screen
  SDL_RenderPresent(sdl_renderer);
}